

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O2

void mbedtls_ecdh_init(mbedtls_ecdh_context *ctx)

{
  mbedtls_ecp_group_init(&ctx->grp);
  mbedtls_mpi_init(&ctx->d);
  mbedtls_ecp_point_init(&ctx->Q);
  mbedtls_ecp_point_init(&ctx->Qp);
  mbedtls_mpi_init(&ctx->z);
  mbedtls_ecp_point_init(&ctx->Vi);
  mbedtls_ecp_point_init(&ctx->Vf);
  mbedtls_mpi_init(&ctx->_d);
  ctx->point_format = 0;
  return;
}

Assistant:

void mbedtls_ecdh_init( mbedtls_ecdh_context *ctx )
{
    ECDH_VALIDATE( ctx != NULL );

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    ecdh_init_internal( ctx );
    mbedtls_ecp_point_init( &ctx->Vi  );
    mbedtls_ecp_point_init( &ctx->Vf  );
    mbedtls_mpi_init( &ctx->_d );
#else
    memset( ctx, 0, sizeof( mbedtls_ecdh_context ) );

    ctx->var = MBEDTLS_ECDH_VARIANT_NONE;
#endif
    ctx->point_format = MBEDTLS_ECP_PF_UNCOMPRESSED;
#if defined(MBEDTLS_ECP_RESTARTABLE)
    ctx->restart_enabled = 0;
#endif
}